

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_TakeStep_Z(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 *puVar1;
  N_Vector p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  N_Vector *pp_Var9;
  int iVar10;
  char *pcVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int do_save_2;
  int do_save_1;
  int do_save;
  int local_4c;
  int local_48;
  int local_44;
  sunrealtype *local_40;
  N_Vector *local_38;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  local_40 = dsmPtr;
  if (puVar1 == (undefined8 *)0x0) {
    arkProcessError(ark_mem,-0x15,0x9a4,"arkStep_TakeStep_Z",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  if ((*(int *)(puVar1 + 4) == 0) && (*(int *)(puVar1 + 0x30) == 0)) {
    *nflagPtr = 0;
  }
  if ((puVar1[0x11] != 0) && (*(long *)(*(long *)(puVar1[0x11] + 8) + 0x10) != 0)) {
    p_Var2 = ark_mem->tempv3;
    N_VConst(0,p_Var2);
    iVar5 = SUNNonlinSolSetup(puVar1[0x11],p_Var2,ark_mem);
    if (iVar5 < 0) {
      return -0x1e;
    }
    if (iVar5 != 0) {
      return -0x1f;
    }
  }
  bVar4 = true;
  if ((ark_mem->relax_enabled != 0) &&
     ((*(int *)(puVar1 + 4) != 0 || (*(int *)(puVar1 + 0x30) == 1)))) {
    bVar4 = false;
  }
  if (*(int *)(puVar1 + 4) == 0) {
    bVar15 = false;
  }
  else {
    bVar15 = *(int *)((long)puVar1 + 0x1c) != 0;
  }
  uVar14 = 1;
  bVar3 = true;
  if (*(int *)(puVar1 + 4) == 0) {
    bVar12 = 0;
  }
  else {
    bVar12 = 0;
    bVar3 = true;
    if (1e-10 < ABS(*(double *)**(undefined8 **)(puVar1[0xf] + 0x10))) {
      bVar12 = 1;
      bVar3 = false;
      uVar14 = 0;
    }
  }
  if (bVar3) {
    if (!bVar4) {
      N_VScale(0x3ff0000000000000,ark_mem->yn,*(undefined8 *)puVar1[8]);
    }
    if (ark_mem->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
      iVar5 = SUNAdjointCheckpointScheme_NeedsSaving
                        (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,0,
                         &local_44);
      if (iVar5 != 0) {
        pcVar11 = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
        iVar7 = 0x6cc;
LAB_0012480e:
        arkProcessError(ark_mem,-0x35,iVar7,"arkStep_TakeStep_Z",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                        ,pcVar11,iVar5);
        return -0x35;
      }
      if ((local_44 != 0) &&
         (iVar5 = SUNAdjointCheckpointScheme_InsertVector
                            (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,0
                             ,ark_mem->ycur), iVar5 != 0)) {
        pcVar11 = "SUNAdjointCheckpointScheme_InsertVector returned %d";
        iVar7 = 0x6dc;
        goto LAB_0012480e;
      }
    }
  }
  if (*(int *)((long)puVar1 + 0x1c) == 0) {
    bVar16 = true;
  }
  else {
    iVar5 = ARKodeButcherTable_IsStifflyAccurate((ARKodeButcherTable)puVar1[0xe]);
    bVar16 = iVar5 != 0;
  }
  if ((*(int *)(puVar1 + 4) != 0) &&
     (iVar5 = ARKodeButcherTable_IsStifflyAccurate((ARKodeButcherTable)puVar1[0xf]), iVar5 == 0)) {
    bVar16 = false;
  }
  if (((*(int *)(puVar1 + 4) == 0) || (*(int *)(puVar1 + 0x18) != 0)) || (*(int *)(puVar1 + 2) == 0)
     ) {
    bVar18 = false;
  }
  else {
    bVar18 = *(int *)(puVar1 + 0x30) != 2;
  }
  bVar17 = ark_mem->interp_type != 0;
  iVar5 = -0x35;
  if ((ark_mem->fn_is_current == 0) && ((!bVar17 || bVar3) || bVar18)) {
    if ((bVar17 && !bVar3) && !(bool)(~bVar15 & bVar12 & bVar18)) {
      if (bVar16) {
        N_VScale(0x3ff0000000000000,
                 ((undefined8 *)puVar1[7])[(long)*(int *)((long)puVar1 + 0x6c) + -1],
                 *(undefined8 *)puVar1[7]);
      }
      else {
        iVar5 = (*(code *)puVar1[1])
                          (ark_mem->tn,ark_mem->yn,*(undefined8 *)puVar1[7],ark_mem->user_data);
        puVar1[0x32] = puVar1[0x32] + 1;
        if (iVar5 < 0) goto LAB_0012494c;
        if (iVar5 != 0) {
          iVar5 = -0xb;
          goto LAB_00124951;
        }
      }
LAB_001249a3:
      iVar5 = -0x35;
      bVar16 = true;
    }
    else {
      iVar5 = (*ark_mem->step_fullrhs)
                        (ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,
                         SUB14(ark_mem->initsetup == 0,0));
      if (iVar5 == 0) {
        ark_mem->fn_is_current = 1;
        goto LAB_001249a3;
      }
LAB_0012494c:
      iVar5 = -8;
LAB_00124951:
      bVar16 = false;
    }
    if (!bVar16) {
      return iVar5;
    }
  }
  puVar1[0x23] = 0;
  if (bVar18) {
    if (bVar3) {
      pp_Var9 = (N_Vector *)puVar1[7];
    }
    else if ((bVar15) || (*(int *)(puVar1 + 0x30) == 1)) {
      pp_Var9 = &ark_mem->tempv5;
      N_VScale(0x3ff0000000000000,*(undefined8 *)puVar1[7],ark_mem->tempv5);
    }
    else {
      pp_Var9 = &ark_mem->fn;
    }
    puVar1[0x23] = *pp_Var9;
  }
  if ((int)uVar14 < *(int *)((long)puVar1 + 0x6c)) {
    local_38 = &ark_mem->tempv1;
    uVar13 = (ulong)uVar14;
    do {
      *(int *)(puVar1 + 0xd) = (int)uVar13;
      if (*(int *)(puVar1 + 4) == 0) {
        lVar8 = 0x70;
LAB_00124ac6:
        bVar15 = false;
        iVar7 = 0;
      }
      else {
        lVar8 = 0x78;
        if (ABS(*(double *)(*(long *)(*(long *)(puVar1[0xf] + 0x10) + uVar13 * 8) + uVar13 * 8)) <=
            1e-10) goto LAB_00124ac6;
        iVar7 = 1;
        bVar15 = true;
      }
      iVar10 = *(int *)((long)puVar1 + 0x24);
      ark_mem->tcur =
           *(double *)(*(long *)(*(long *)((long)puVar1 + lVar8) + 0x18) + uVar13 * 8) * ark_mem->h
           + ark_mem->tn;
      if (((*(int *)(puVar1 + 0x30) == 2) && ((code *)puVar1[0x2b] != (code *)0x0)) &&
         (iVar6 = (*(code *)puVar1[0x2b])
                            (ark_mem->tcur,ark_mem,ark_mem->tempv1,ark_mem->tempv2,ark_mem->tempv3),
         iVar6 != 0)) {
        return -0xf;
      }
      if (bVar15) {
        iVar6 = arkStep_Predict(ark_mem,(int)uVar13,(N_Vector)puVar1[10]);
        if (iVar6 != 0) {
          return iVar6;
        }
        if ((code *)puVar1[0x10] != (code *)0x0) {
          iVar6 = (*(code *)puVar1[0x10])(ark_mem->tcur,puVar1[10],ark_mem->user_data);
          if (iVar6 < 0) {
            return -0x27;
          }
          if (iVar6 != 0) {
            return 5;
          }
        }
      }
      iVar7 = arkStep_StageSetup(ark_mem,iVar7);
      if (iVar7 != 0) {
        return iVar7;
      }
      if (bVar15) {
        iVar7 = arkStep_Nls(ark_mem,*nflagPtr);
        *nflagPtr = iVar7;
        if (iVar7 != 0) {
          return 5;
        }
      }
      else {
        if (*(int *)(puVar1 + 0x30) == 1) {
          iVar7 = (*(code *)puVar1[0x2d])(puVar1[0x1e],ark_mem,puVar1[9]);
          *nflagPtr = iVar7;
          if (iVar7 != 0) {
            return 5;
          }
        }
        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,ark_mem->yn,puVar1[9],ark_mem->ycur);
      }
      if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
         (iVar7 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
         iVar7 != 0)) {
        return -0x26;
      }
      if (!bVar4) {
        N_VScale(0x3ff0000000000000,ark_mem->ycur,*(undefined8 *)(puVar1[8] + uVar13 * 8));
      }
      if (ark_mem->checkpoint_scheme != (SUNAdjointCheckpointScheme)0x0) {
        iVar7 = SUNAdjointCheckpointScheme_NeedsSaving
                          (ark_mem->tcur,ark_mem->checkpoint_scheme,ark_mem->checkpoint_step_idx,
                           uVar13,&local_48);
        if (iVar7 == 0) {
          bVar3 = true;
          if ((local_48 != 0) &&
             (iVar7 = SUNAdjointCheckpointScheme_InsertVector
                                (ark_mem->tcur,ark_mem->checkpoint_scheme,
                                 ark_mem->checkpoint_step_idx,uVar13,ark_mem->ycur), iVar7 != 0)) {
            iVar6 = 0x807;
            pcVar11 = "SUNAdjointCheckpointScheme_InsertVector returned %d";
            goto LAB_00124cb3;
          }
        }
        else {
          iVar6 = 0x7f6;
          pcVar11 = "SUNAdjointCheckpointScheme_NeedsSaving returned %d";
LAB_00124cb3:
          bVar3 = false;
          iVar5 = -0x35;
          arkProcessError(ark_mem,-0x35,iVar6,"arkStep_TakeStep_Z",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                          ,pcVar11,iVar7);
        }
        if (!bVar3) {
          return iVar5;
        }
      }
      bVar15 = (bool)(bVar15 & iVar10 != 0);
      if (*(int *)(puVar1 + 4) != 0) {
        if (bVar15) {
          pp_Var9 = (N_Vector *)(puVar1 + 0xb);
          if ((*(int *)(puVar1 + 0x30) == 1) &&
             (iVar7 = (*(code *)puVar1[0x2c])(ark_mem,puVar1[0xb],ark_mem->tempv1),
             pp_Var9 = local_38, iVar7 != 0)) {
            return -0x12;
          }
          N_VLinearSum(1.0 / (double)puVar1[0x14],-1.0 / (double)puVar1[0x14],*pp_Var9,puVar1[9],
                       *(undefined8 *)(puVar1[7] + uVar13 * 8));
        }
        else {
          iVar7 = (*(code *)puVar1[1])
                            (ark_mem->tcur,ark_mem->ycur,*(undefined8 *)(puVar1[7] + uVar13 * 8),
                             ark_mem->user_data);
          puVar1[0x32] = puVar1[0x32] + 1;
          if (iVar7 < 0) {
            return -8;
          }
          if (iVar7 != 0) {
            return -0xb;
          }
        }
      }
      if (*(int *)((long)puVar1 + 0x1c) != 0) {
        iVar7 = (*(code *)*puVar1)(*(double *)(*(long *)(puVar1[0xe] + 0x18) + uVar13 * 8) *
                                   ark_mem->h + ark_mem->tn,ark_mem->ycur,
                                   *(undefined8 *)(puVar1[6] + uVar13 * 8),ark_mem->user_data);
        puVar1[0x31] = puVar1[0x31] + 1;
        if (iVar7 < 0) {
          return -8;
        }
        if (iVar7 != 0) {
          return -0xb;
        }
      }
      if (*(int *)(puVar1 + 0x30) == 2) {
        if (*(int *)(puVar1 + 4) != 0 && !bVar15) {
          iVar7 = (*(code *)puVar1[0x2d])
                            (puVar1[0x1e],ark_mem,*(undefined8 *)(puVar1[7] + uVar13 * 8));
          *nflagPtr = iVar7;
          if (iVar7 != 0) {
            return 5;
          }
        }
        if (*(int *)((long)puVar1 + 0x1c) != 0) {
          iVar7 = (*(code *)puVar1[0x2d])
                            (puVar1[0x1e],ark_mem,*(undefined8 *)(puVar1[6] + uVar13 * 8));
          *nflagPtr = iVar7;
          if (iVar7 != 0) {
            return 5;
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < *(int *)((long)puVar1 + 0x6c));
  }
  if (*(int *)(puVar1 + 0x30) == 1) {
    iVar7 = arkStep_ComputeSolutions_MassFixed(ark_mem,local_40);
  }
  else {
    iVar7 = arkStep_ComputeSolutions(ark_mem,local_40);
  }
  *nflagPtr = iVar7;
  if (iVar7 < 0) {
    return iVar7;
  }
  if (iVar7 != 0) {
    return 5;
  }
  if (ark_mem->checkpoint_scheme == (SUNAdjointCheckpointScheme)0x0) {
    return 0;
  }
  iVar7 = SUNAdjointCheckpointScheme_NeedsSaving
                    (ark_mem->tn + ark_mem->h,ark_mem->checkpoint_scheme,
                     ark_mem->checkpoint_step_idx,(long)*(int *)(puVar1[0xe] + 8),&local_4c);
  if (iVar7 == 0) {
    bVar4 = true;
    if ((local_4c == 0) ||
       (iVar7 = SUNAdjointCheckpointScheme_InsertVector
                          (ark_mem->tn + ark_mem->h,ark_mem->checkpoint_scheme,
                           ark_mem->checkpoint_step_idx,(long)*(int *)(puVar1[0xe] + 8),
                           ark_mem->ycur), iVar7 == 0)) goto LAB_00124f67;
    iVar10 = 0x89e;
  }
  else {
    iVar10 = 0x88e;
  }
  bVar4 = false;
  iVar5 = -0x35;
  arkProcessError(ark_mem,-0x35,iVar10,"arkStep_TakeStep_Z",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,"SUNAdjointCheckpointScheme_NeedsSaving returned %d",iVar7);
LAB_00124f67:
  if (bVar4) {
    return 0;
  }
  return iVar5;
}

Assistant:

int arkStep_TakeStep_Z(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval, is, is_start, mode;
  sunbooleantype implicit_stage;
  sunbooleantype deduce_stage;
  sunbooleantype save_stages;
  sunbooleantype stiffly_accurate;
  sunbooleantype save_fn_for_interp;
  sunbooleantype imex_method;
  sunbooleantype save_fn_for_residual;
  sunbooleantype eval_rhs;
  ARKodeARKStepMem step_mem;
  N_Vector zcor0;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if problem will involve no algebraic solvers, initialize nflagPtr to success */
  if ((!step_mem->implicit) && (step_mem->mass_type == MASS_IDENTITY))
  {
    *nflagPtr = ARK_SUCCESS;
  }

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
  {
    if ((step_mem->NLS)->ops->setup)
    {
      zcor0 = ark_mem->tempv3;
      N_VConst(ZERO,
               zcor0); /* set guess to all 0 (since using predictor-corrector form) */
      retval = SUNNonlinSolSetup(step_mem->NLS, zcor0, ark_mem);

      SUNLogInfoIf(retval != 0, ARK_LOGGER, "setup-nonlinear-solver",
                   "status = failed nonlinear solver setup, retval = %i", retval);

      if (retval < 0) { return (ARK_NLS_SETUP_FAIL); }
      if (retval > 0) { return (ARK_NLS_SETUP_RECVR); }
    }
  }

  /* check if we need to store stage values */
  save_stages = SUNFALSE;
  if (ark_mem->relax_enabled &&
      (step_mem->implicit || step_mem->mass_type == MASS_FIXED))
  {
    save_stages = SUNTRUE;
  }

  /* check for an ImEx method */
  imex_method = step_mem->implicit && step_mem->explicit;

  /* check for implicit method with an explicit first stage */
  implicit_stage = SUNFALSE;
  is_start       = 1;
  if (step_mem->implicit)
  {
    if (SUNRabs(step_mem->Bi->A[0][0]) > TINY)
    {
      implicit_stage = SUNTRUE;
      is_start       = 0;
    }
  }

  /* explicit first stage -- store stage if necessary for relaxation or checkpointing */
  if (is_start == 1)
  {
    if (save_stages) { N_VScale(ONE, ark_mem->yn, step_mem->z[0]); }

    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, 0,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx, 0,
                                                  ark_mem->tcur, ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }
  }

  /* check if the method is Stiffly Accurate (SA) */
  stiffly_accurate = SUNTRUE;
  if (step_mem->explicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Be))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  if (step_mem->implicit)
  {
    if (!ARKodeButcherTable_IsStifflyAccurate(step_mem->Bi))
    {
      stiffly_accurate = SUNFALSE;
    }
  }

  /* Save f(tn, yn) for Hermite interpolation */
  save_fn_for_interp = ark_mem->interp_type == ARK_INTERP_HERMITE;

  /* For an implicit or ImEx method using the trivial predictor with an
     autonomous problem with an identity or fixed mass matrix, save fi(tn, yn)
     for reuse in the first residual evaluation of each stage solve */
  save_fn_for_residual = step_mem->implicit && step_mem->predictor == 0 &&
                         step_mem->autonomous &&
                         step_mem->mass_type != MASS_TIMEDEP;

  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, 0,
               implicit_stage, ark_mem->tcur);
  SUNLogExtraDebugVecIf(is_start == 1, ARK_LOGGER, "explicit stage",
                        ark_mem->yn, "z_0(:) =");

  /* Call the RHS if needed. */
  eval_rhs = !implicit_stage || save_fn_for_interp || save_fn_for_residual;

  if (!(ark_mem->fn_is_current) && eval_rhs)
  {
    /* If saving the RHS evaluation for reuse in the residual, call the full RHS
       for all implicit methods or for ImEx methods with an explicit first
       stage. ImEx methods with an implicit first stage may not need to evaluate
       fe depending on the interpolation type (covered by save_fn_for_interp) */
    sunbooleantype res_full_rhs = save_fn_for_residual && implicit_stage &&
                                  !imex_method;

    if (!implicit_stage || save_fn_for_interp || res_full_rhs)
    {
      /* Need full RHS evaluation. If this is the first step, then we evaluate
         or copy the RHS values from an earlier evaluation (e.g., to compute
         h0). For subsequent steps treat this call as an evaluation at the end
         of the just completed step (tn, yn) and potentially reuse the
         evaluation (FSAL method) or save the value for later use. */
      mode   = (ark_mem->initsetup) ? ARK_FULLRHS_START : ARK_FULLRHS_END;
      retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                     ark_mem->fn, mode);
      if (retval)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed full rhs eval, retval = %i", retval);
        return ARK_RHSFUNC_FAIL;
      }
      ark_mem->fn_is_current = SUNTRUE;
    }
    else
    {
      /* For an ImEx method with implicit first stage and an interpolation
         method that does not need fn (e.g., Lagrange), only evaluate fi (if
         necessary) for reuse in the residual */
      if (stiffly_accurate)
      {
        N_VScale(ONE, step_mem->Fi[step_mem->stages - 1], step_mem->Fi[0]);
      }
      else
      {
        retval = step_mem->fi(ark_mem->tn, ark_mem->yn, step_mem->Fi[0],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return ARK_RHSFUNC_FAIL; }
        if (retval > 0) { return ARK_UNREC_RHSFUNC_ERR; }
      }
    }
  }

  /* Set alias to implicit RHS evaluation for reuse in residual */
  step_mem->fn_implicit = NULL;
  if (save_fn_for_residual)
  {
    if (!implicit_stage)
    {
      /* Explicit first stage -- Fi[0] will be retained */
      step_mem->fn_implicit = step_mem->Fi[0];
    }
    else
    {
      /* Implicit first stage -- Fi[0] will be overwritten */
      if (imex_method || step_mem->mass_type == MASS_FIXED)
      {
        /* Copy from Fi[0] as fn includes fe or M^{-1} */
        N_VScale(ONE, step_mem->Fi[0], ark_mem->tempv5);
        step_mem->fn_implicit = ark_mem->tempv5;
      }
      else
      {
        /* fn is the same as Fi[0] but will not be overwritten */
        step_mem->fn_implicit = ark_mem->fn;
      }
    }
  }

  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->implicit, ARK_LOGGER,
                        "implicit RHS", step_mem->Fi[0], "Fi_0(:) =");
  SUNLogExtraDebugVecIf(is_start == 1 && step_mem->explicit, ARK_LOGGER,
                        "explicit RHS", step_mem->Fe[0], "Fe_0(:) =");
  SUNLogInfoIf(is_start == 1, ARK_LOGGER, "end-stage", "status = success");

  /* loop over internal stages to the step */
  for (is = is_start; is < step_mem->stages; is++)
  {
    /* store current stage index */
    step_mem->istage = is;

    /* determine whether implicit solve is required */
    implicit_stage = SUNFALSE;
    if (step_mem->implicit)
    {
      if (SUNRabs(step_mem->Bi->A[is][is]) > TINY) { implicit_stage = SUNTRUE; }
    }

    /* determine if the stage RHS will be deduced from the implicit solve */
    deduce_stage = step_mem->deduce_rhs && implicit_stage;

    /* set current stage time(s) */
    if (step_mem->implicit)
    {
      ark_mem->tcur = ark_mem->tn + step_mem->Bi->c[is] * ark_mem->h;
    }
    else { ark_mem->tcur = ark_mem->tn + step_mem->Be->c[is] * ark_mem->h; }

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, implicit = %i, tcur = " SUN_FORMAT_G, is,
               implicit_stage, ark_mem->tcur);

    /* setup time-dependent mass matrix */
    if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL))
    {
      retval = step_mem->msetup((void*)ark_mem, ark_mem->tcur, ark_mem->tempv1,
                                ark_mem->tempv2, ark_mem->tempv3);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed mass setup, retval = %i", retval);
        return (ARK_MASSSETUP_FAIL);
      }
    }

    /* if implicit, call built-in and user-supplied predictors
       (results placed in zpred) */
    if (implicit_stage)
    {
      retval = arkStep_Predict(ark_mem, is, step_mem->zpred);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed predict, retval = %i", retval);
        return (retval);
      }

      /* if a user-supplied predictor routine is provided, call that here.
         Note that arkStep_Predict is *still* called, so this user-supplied
         routine can just 'clean up' the built-in prediction, if desired. */
      if (step_mem->stage_predict)
      {
        retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                         ark_mem->user_data);

        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
        if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
        if (retval > 0) { return (TRY_AGAIN); }
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred, "zpred(:) =");
    }

    /* set up explicit data for evaluation of ARK stage (store in sdata) */
    retval = arkStep_StageSetup(ark_mem, implicit_stage);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed stage setup, retval = %i", retval);
      return (retval);
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata, "sdata(:) =");

    /* perform implicit solve if required */
    if (implicit_stage)
    {
      /* implicit solve result is stored in ark_mem->ycur;
         return with positive value on anything but success */
      *nflagPtr = arkStep_Nls(ark_mem, *nflagPtr);
      if (*nflagPtr != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage", "status = failed solve, nflag = %i",
                   *nflagPtr);
        return (TRY_AGAIN);
      }

      SUNLogExtraDebugVec(ARK_LOGGER, "implicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);

      /* otherwise no implicit solve is needed */
    }
    else
    {
      /* if M is fixed, solve with it to compute update (place back in sdata) */
      if (step_mem->mass_type == MASS_FIXED)
      {
        /* perform solve; return with positive value on anything but success */
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->sdata,
                                     step_mem->nlscoef);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }

      /* set y to be yn + sdata (either computed in arkStep_StageSetup,
         or updated in prev. block) */
      N_VLinearSum(ONE, ark_mem->yn, ONE, step_mem->sdata, ark_mem->ycur);

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit stage", ark_mem->ycur,
                          "z_%i(:) =", is);
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    /* NOTE: with internally inconsistent IMEX methods (c_i^E != c_i^I) the value
       of tcur corresponds to the stage time from the implicit table (c_i^I). */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
    }

    /* successful stage solve */

    /*    store stage (if necessary for relaxation) */
    if (save_stages) { N_VScale(ONE, ark_mem->ycur, step_mem->z[is]); }

    /*    checkpoint stage for adjoint (if necessary) */
    if (ark_mem->checkpoint_scheme)
    {
      sunbooleantype do_save;
      SUNErrCode errcode =
        SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                               ark_mem->checkpoint_step_idx, is,
                                               ark_mem->tcur, &do_save);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }

      if (do_save)
      {
        errcode =
          SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                  ark_mem->checkpoint_step_idx,
                                                  is, ark_mem->tcur,
                                                  ark_mem->ycur);

        if (errcode)
        {
          arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                          __FILE__,
                          "SUNAdjointCheckpointScheme_InsertVector returned %d",
                          errcode);
          return ARK_ADJ_CHECKPOINT_FAIL;
        }
      }
    }

    /*    store implicit RHS (value in Fi[is] is from preceding nonlinear iteration) */
    if (step_mem->implicit)
    {
      if (!deduce_stage)
      {
        retval = step_mem->fi(ark_mem->tcur, ark_mem->ycur, step_mem->Fi[is],
                              ark_mem->user_data);
        step_mem->nfi++;

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed implicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
      }
      else
      {
        if (step_mem->mass_type == MASS_FIXED)
        {
          retval = step_mem->mmult((void*)ark_mem, step_mem->zcor,
                                   ark_mem->tempv1);
          if (retval != ARK_SUCCESS)
          {
            SUNLogInfo(ARK_LOGGER, "end-stage",
                       "status = failed mass mult, retval = %i", retval);
            return (ARK_MASSMULT_FAIL);
          }

          N_VLinearSum(ONE / step_mem->gamma, ark_mem->tempv1,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata, step_mem->Fi[is]);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);
      }
    }

    /*    store explicit RHS */
    if (step_mem->explicit)
    {
      retval = step_mem->fe(ark_mem->tn + step_mem->Be->c[is] * ark_mem->h,
                            ark_mem->ycur, step_mem->Fe[is], ark_mem->user_data);
      step_mem->nfe++;

      SUNLogExtraDebugVec(ARK_LOGGER, "explicit RHS", step_mem->Fe[is],
                          "Fe_%i(:) =", is);
      SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                   "status = failed explicit rhs eval, retval = %i", retval);

      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }
    }

    /* if using a time-dependent mass matrix, update Fe[is] and/or Fi[is] with M(t)^{-1} */
    if (step_mem->mass_type == MASS_TIMEDEP)
    {
      /* If the implicit stage was deduced, it already includes M(t)^{-1} */
      if (step_mem->implicit && !deduce_stage)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fi[is],
                                     step_mem->nlscoef);

        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} implicit RHS", step_mem->Fi[is],
                            "Fi_%i(:) =", is);

        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      if (step_mem->explicit)
      {
        *nflagPtr = step_mem->msolve((void*)ark_mem, step_mem->Fe[is],
                                     step_mem->nlscoef);
        SUNLogExtraDebugVec(ARK_LOGGER, "M^{-1} explicit RHS", step_mem->Fe[is],
                            "Fe_%i(:) =", is);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed mass solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
    }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  SUNLogInfo(ARK_LOGGER, "begin-compute-solution", "mass type = %i",
             step_mem->mass_type);

  /* compute time-evolved solution (in ark_ycur), error estimate (in dsm).
     This can fail recoverably due to nonconvergence of the mass matrix solve,
     so handle that appropriately. */
  if (step_mem->mass_type == MASS_FIXED)
  {
    *nflagPtr = arkStep_ComputeSolutions_MassFixed(ark_mem, dsmPtr);
  }
  else { *nflagPtr = arkStep_ComputeSolutions(ark_mem, dsmPtr); }

  SUNLogInfoIf(*nflagPtr != ARK_SUCCESS, ARK_LOGGER, "end-compute-solution",
               "status = failed compute solution, retval = %i", *nflagPtr);

  if (*nflagPtr < 0) { return (*nflagPtr); }
  if (*nflagPtr > 0) { return (TRY_AGAIN); }

  if (ark_mem->checkpoint_scheme)
  {
    sunbooleantype do_save;
    SUNErrCode errcode =
      SUNAdjointCheckpointScheme_NeedsSaving(ark_mem->checkpoint_scheme,
                                             ark_mem->checkpoint_step_idx,
                                             step_mem->Be->stages,
                                             ark_mem->tn + ark_mem->h, &do_save);
    if (errcode)
    {
      arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                      __FILE__,
                      "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                      errcode);
      return ARK_ADJ_CHECKPOINT_FAIL;
    }
    if (do_save)
    {
      errcode =
        SUNAdjointCheckpointScheme_InsertVector(ark_mem->checkpoint_scheme,
                                                ark_mem->checkpoint_step_idx,
                                                step_mem->Be->stages,
                                                ark_mem->tn + ark_mem->h,
                                                ark_mem->ycur);
      if (errcode)
      {
        arkProcessError(ark_mem, ARK_ADJ_CHECKPOINT_FAIL, __LINE__, __func__,
                        __FILE__,
                        "SUNAdjointCheckpointScheme_NeedsSaving returned %d",
                        errcode);
        return ARK_ADJ_CHECKPOINT_FAIL;
      }
    }
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "end-compute-solution", "status = success");

  return (ARK_SUCCESS);
}